

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O3

void test_paf_score_graph_hw(void)

{
  float peaks_b [4];
  float peaks_a [4];
  float score_graph [4];
  float local_88 [16];
  float paf_i [16];
  
  paf_i[0] = 0.0;
  paf_i[1] = 0.0;
  paf_i[4] = 0.0;
  paf_i[5] = 0.0;
  paf_i[8] = 0.0;
  paf_i[9] = 0.0;
  paf_i[0xc] = 0.0;
  paf_i[0xd] = 0.0;
  paf_i[2] = 0.0;
  paf_i[3] = -1.0;
  paf_i[6] = 0.0;
  paf_i[7] = -1.0;
  paf_i[10] = 0.0;
  paf_i[0xb] = -1.0;
  paf_i[0xe] = 0.0;
  paf_i[0xf] = -1.0;
  local_88[0xc] = 0.0;
  local_88[0xd] = 0.0;
  local_88[0xe] = 0.0;
  local_88[0xf] = 0.0;
  local_88[4] = 0.0;
  local_88[5] = 0.0;
  local_88[6] = 0.0;
  local_88[7] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  local_88[8] = 1.0;
  local_88[9] = 1.0;
  local_88[10] = 1.0;
  local_88[0xb] = 0.0;
  peaks_a[0] = 0.625;
  peaks_a[1] = 0.125;
  peaks_a[2] = 0.875;
  peaks_a[3] = 0.875;
  peaks_b[0] = 0.625;
  peaks_b[1] = 0.625;
  peaks_b[2] = 0.125;
  peaks_b[3] = 0.875;
  trt_pose::parse::paf_score_graph_out_hw(score_graph,paf_i,local_88,2,2,peaks_a,peaks_b,4,4,2,3);
  return;
}

Assistant:

void test_paf_score_graph_hw()
{
  const int M = 2;
  const int H = 4;
  const int W = 4;
  const int counts_a = 2;
  const int counts_b = 2;
  const int num_integral_samples = 3;

  float score_graph[M * M];

  // test points
  //
  // _ _ _ b
  // _ _ _ |
  // a - b |
  // _ _ _ a
  
  const float paf_i[H * W] = {
    0., 0., 0., -1.,
    0., 0., 0., -1.,
    0., 0., 0., -1.,
    0., 0., 0., -1.
  };
  const float paf_j[H * W] = {
    0., 0., 0., 0.,
    0., 0., 0., 0.,
    1., 1., 1., 0.,
    0., 0., 0., 0.
  };
  const float peaks_a[M * 2] = {
    0.625, 0.125, // mid-left
    0.875, 0.875  // bot-right
  };
  const float peaks_b[M * 2] = {
    0.625, 0.625, // mid-mid
    0.125, 0.875  // top-right
  };
  
  paf_score_graph_out_hw(
      score_graph,
      paf_i,
      paf_j,
      counts_a,
      counts_b,
      peaks_a,
      peaks_b,
      H, W, M,
      num_integral_samples
      );
}